

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall CompressedXipReader::loadmemrd(CompressedXipReader *this)

{
  ByteVectorReader *this_00;
  shared_ptr<MemoryReader> local_48;
  ulong local_38;
  uint64_t savedpos;
  undefined1 local_20 [8];
  shared_ptr<MemoryReader> memrd;
  CompressedXipReader *this_local;
  
  memrd.super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  this_00 = (ByteVectorReader *)operator_new(0x40);
  ByteVectorReader::ByteVectorReader(this_00);
  std::shared_ptr<MemoryReader>::shared_ptr<ByteVectorReader,void>
            ((shared_ptr<MemoryReader> *)local_20,this_00);
  local_38 = (ulong)this->_pos;
  (*(this->super_ReadWriter)._vptr_ReadWriter[4])(this,0);
  std::shared_ptr<MemoryReader>::shared_ptr(&local_48,(shared_ptr<MemoryReader> *)local_20);
  ReadWriter::copyto<std::shared_ptr<MemoryReader>>(&this->super_ReadWriter,&local_48);
  std::shared_ptr<MemoryReader>::~shared_ptr(&local_48);
  std::shared_ptr<MemoryReader>::operator=(&this->_memrd,(shared_ptr<MemoryReader> *)local_20);
  (*(this->super_ReadWriter)._vptr_ReadWriter[4])(this,local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->_compsizes);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->_compptrs);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_cache);
  this->_cachepos = 0;
  std::shared_ptr<MemoryReader>::~shared_ptr((shared_ptr<MemoryReader> *)local_20);
  return;
}

Assistant:

void loadmemrd()
    {
        std::shared_ptr<MemoryReader> memrd(new ByteVectorReader());
        uint64_t savedpos= _pos;

        setpos(0);
        copyto(memrd);

        // from now on all read/writes are done via memrd
        _memrd= memrd;
        setpos(savedpos);

        // discard ptrs into live image
        _compsizes.clear();
        _compptrs.clear();
        _cache.clear();
        _cachepos= 0;
    }